

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::reserve(vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *this,size_t n)

{
  long *plVar1;
  memory_resource *pmVar2;
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *poVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  ulong uVar7;
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *poVar5;
  
  if (this->nAlloc < n) {
    if (n * 0x30 == 0) {
      poVar5 = (optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
    }
    else {
      pmVar2 = (this->alloc).memoryResource;
      iVar4 = (*pmVar2->_vptr_memory_resource[2])(pmVar2,n * 0x30,8);
      poVar5 = (optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(extraout_var,iVar4);
    }
    if (this->nStored != 0) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::optional((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&poVar5->optionalValue + lVar6),
                   (optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&this->ptr->optionalValue + lVar6));
        poVar3 = this->ptr;
        if ((&poVar3->set)[lVar6] == true) {
          plVar1 = (long *)((poVar3->optionalValue).__data + lVar6 + 0x18);
          if (plVar1 != (long *)plVar1[-2]) {
            operator_delete((long *)plVar1[-2],*plVar1 + 1);
          }
          (&poVar3->set)[lVar6] = false;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x30;
      } while (uVar7 < this->nStored);
    }
    if (this->ptr !=
        (optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      pmVar2 = (this->alloc).memoryResource;
      (*pmVar2->_vptr_memory_resource[3])(pmVar2,this->ptr,this->nAlloc * 0x30,8);
    }
    this->nAlloc = n;
    this->ptr = poVar5;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }